

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O0

void __thiscall KryoFlux::SamBaCommand(KryoFlux *this,string *cmd,string *end)

{
  undefined4 uVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  string *psVar8;
  allocator local_279;
  string local_278 [32];
  int local_258;
  int len;
  char local_248 [8];
  uint8_t buf [512];
  string local_40 [8];
  string s;
  string *end_local;
  string *cmd_local;
  KryoFlux *this_local;
  
  s.field_2._8_8_ = end;
  std::__cxx11::string::string(local_40);
  uVar3 = std::__cxx11::string::c_str();
  uVar1 = std::__cxx11::string::length();
  (**(code **)(*(long *)this + 0x28))(this,uVar3,uVar1);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    do {
      do {
        local_258 = (**(code **)(*(long *)this + 0x20))(this,local_248,0x200);
        uVar4 = (ulong)local_258;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_278,local_248,uVar4,&local_279);
        std::__cxx11::string::operator+=(local_40,local_278);
        std::__cxx11::string::~string(local_278);
        std::allocator<char>::~allocator((allocator<char> *)&local_279);
        uVar4 = std::__cxx11::string::length();
        uVar5 = std::__cxx11::string::length();
      } while (uVar4 < uVar5);
      lVar6 = std::__cxx11::string::length();
      lVar7 = std::__cxx11::string::length();
      psVar8 = (string *)std::__cxx11::string::length();
      iVar2 = std::__cxx11::string::compare((ulong)local_40,lVar6 - lVar7,psVar8);
    } while (iVar2 != 0);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void KryoFlux::SamBaCommand(const std::string& cmd, const std::string& end)
{
    std::string s;
    uint8_t buf[512];

    try
    {
        Write(cmd.c_str(), static_cast<int>(cmd.length()));

        if (!end.empty())
        {
            for (;;)
            {
                auto len = Read(buf, sizeof(buf));

                s += std::string(reinterpret_cast<char*>(buf), len);

                if (s.length() >= end.length() &&
                    s.compare(s.length() - end.length(), end.length(), end) == 0)
                {
                    break;
                }
            }
        }
    }
    catch (...)
    {
        throw util::exception("firmware upload failed, try resetting device");
    }
}